

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.h
# Opt level: O0

shared_ptr<cppmetrics::Histogram> __thiscall
cppmetrics::Registry::
get_or_add<cppmetrics::Histogram,cppmetrics::Registry::histogram(std::__cxx11::string_const&)::__0>
          (Registry *this,string *name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
          *collection,anon_class_1_0_00000001 *factory)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<cppmetrics::Histogram> sVar4;
  _Self local_88;
  _Self local_80;
  undefined1 local_78 [8];
  unique_lock<std::shared_timed_mutex> lock;
  _Self local_60 [3];
  _Self local_48;
  undefined1 local_40 [8];
  shared_lock<std::shared_timed_mutex> read_lock;
  anon_class_1_0_00000001 *factory_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
  *collection_local;
  string *name_local;
  Registry *this_local;
  shared_ptr<cppmetrics::Histogram> *metric;
  
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_40,(mutex_type *)name);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(name + 0x38),(key_type *)collection);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(name + 0x38));
  lock._12_1_ = std::operator!=(&local_48,local_60);
  if ((bool)lock._12_1_) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
                           *)factory,(key_type *)collection);
    std::shared_ptr<cppmetrics::Histogram>::shared_ptr
              ((shared_ptr<cppmetrics::Histogram> *)this,pmVar2);
  }
  lock._13_3_ = 0;
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_40);
  _Var3._M_pi = extraout_RDX;
  if (lock._12_4_ == 0) {
    std::unique_lock<std::shared_timed_mutex>::unique_lock
              ((unique_lock<std::shared_timed_mutex> *)local_78,(mutex_type *)name);
    local_80._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(name + 0x38),(key_type *)collection);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(name + 0x38));
    bVar1 = std::operator!=(&local_80,&local_88);
    if (bVar1) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
                             *)factory,(key_type *)collection);
      std::shared_ptr<cppmetrics::Histogram>::shared_ptr
                ((shared_ptr<cppmetrics::Histogram> *)this,pmVar2);
    }
    else {
      histogram::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(name + 0x38),(value_type *)collection);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
                             *)factory,(key_type *)collection);
      std::shared_ptr<cppmetrics::Histogram>::operator=
                (pmVar2,(shared_ptr<cppmetrics::Histogram> *)this);
    }
    lock._12_4_ = 1;
    std::unique_lock<std::shared_timed_mutex>::~unique_lock
              ((unique_lock<std::shared_timed_mutex> *)local_78);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppmetrics::Histogram>)
         sVar4.super___shared_ptr<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> Registry::get_or_add(
    const std::string& name,
    std::map<std::string, std::shared_ptr<T>>& collection,
    Factory&& factory)
{
  { // scope for RAII shared-read lock
    std::shared_lock<std::shared_timed_mutex> read_lock(m_mutex);
    if (m_names.find(name) != m_names.end())
    {
      return collection[name];
    }
  }

  std::unique_lock<std::shared_timed_mutex> lock(m_mutex);
  if (m_names.find(name) != m_names.end())
  {
    return collection[name];
  }
  else
  {
    std::shared_ptr<T> metric = factory();
    m_names.insert(name);
    collection[name] = metric;
    return metric;
  }
}